

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O3

void __thiscall mognetwork::Packet::~Packet(Packet *this)

{
  ReadedDatas *pRVar1;
  pointer pcVar2;
  
  this->_vptr_Packet = (_func_int **)&PTR__Packet_00113a60;
  pRVar1 = this->m_dataPack;
  if (pRVar1 == (ReadedDatas *)0x0) {
    pRVar1 = (ReadedDatas *)this->m_data;
    if (pRVar1 == (ReadedDatas *)0x0) {
      return;
    }
    pcVar2 = (pointer)pRVar1->readed;
  }
  else {
    pcVar2 = (pRVar1->datas).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  operator_delete(pRVar1);
  return;
}

Assistant:

Packet::~Packet()
  {
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
  }